

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O0

int __thiscall cmGraphVizWriter::CollectAllExternalLibs(cmGraphVizWriter *this,int cnt)

{
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *this_00;
  cmGeneratorTarget *this_01;
  bool bVar1;
  reference ppcVar2;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *this_02;
  reference ppcVar3;
  string *psVar4;
  LinkLibraryVectorType *this_03;
  ostream *this_04;
  mapped_type *this_05;
  mapped_type *ppcVar5;
  string local_280 [32];
  undefined1 local_260 [8];
  ostringstream ostr;
  iterator local_e8;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>
  local_e0;
  iterator local_d8;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>
  local_d0;
  const_iterator tarIt;
  cmTarget *tgt;
  undefined1 local_b0 [8];
  string libName;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>
  *llit;
  const_iterator __end3;
  const_iterator __begin3;
  LinkLibraryVectorType *__range3;
  LinkLibraryVectorType *ll;
  string *realTargetName;
  cmGeneratorTarget *target;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *__range2;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *targets;
  cmLocalGenerator *lg;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *__range1;
  int cnt_local;
  cmGraphVizWriter *this_local;
  
  this_00 = this->LocalGenerators;
  __end1 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::begin(this_00);
  lg = (cmLocalGenerator *)
       std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::end(this_00);
  __range1._4_4_ = cnt;
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                                     *)&lg), bVar1) {
    ppcVar2 = __gnu_cxx::
              __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
              ::operator*(&__end1);
    this_02 = cmLocalGenerator::GetGeneratorTargets(*ppcVar2);
    __end2 = std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::begin(this_02);
    target = (cmGeneratorTarget *)
             std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::end(this_02);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                                       *)&target), bVar1) {
      ppcVar3 = __gnu_cxx::
                __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                ::operator*(&__end2);
      this_01 = *ppcVar3;
      psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(this_01);
      bVar1 = IgnoreThisTarget(this,psVar4);
      if (!bVar1) {
        this_03 = cmTarget::GetOriginalLinkLibraries_abi_cxx11_(this_01->Target);
        __end3 = std::
                 vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
                 ::begin(this_03);
        llit = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>
                *)std::
                  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
                  ::end(this_03);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>_>
                                           *)&llit), bVar1) {
          libName.field_2._8_8_ =
               __gnu_cxx::
               __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>_>
               ::operator*(&__end3);
          std::__cxx11::string::string((string *)local_b0,(string *)libName.field_2._8_8_);
          bVar1 = IgnoreThisTarget(this,(string *)local_b0);
          if (!bVar1) {
            bVar1 = cmGlobalGenerator::IsAlias(this->GlobalGenerator,(string *)local_b0);
            if ((bVar1) &&
               (tarIt._M_node =
                     (_Base_ptr)
                     cmGlobalGenerator::FindTarget(this->GlobalGenerator,(string *)local_b0,false),
               tarIt._M_node != (_Base_ptr)0x0)) {
              psVar4 = cmTarget::GetName_abi_cxx11_((cmTarget *)tarIt._M_node);
              std::__cxx11::string::operator=((string *)local_b0,(string *)psVar4);
            }
            local_d8._M_node =
                 (_Base_ptr)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>_>
                 ::find(&this->TargetPtrs,(key_type *)local_b0);
            std::
            _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>
            ::_Rb_tree_const_iterator(&local_d0,&local_d8);
            local_e8._M_node =
                 (_Base_ptr)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>_>
                 ::end(&this->TargetPtrs);
            std::
            _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>
            ::_Rb_tree_const_iterator(&local_e0,&local_e8);
            bVar1 = std::operator==(&local_d0,&local_e0);
            if (bVar1) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_260);
              this_04 = std::operator<<((ostream *)local_260,(string *)&this->GraphNodePrefix);
              std::ostream::operator<<(this_04,__range1._4_4_);
              std::__cxx11::ostringstream::str();
              this_05 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator[](&this->TargetNamesNodes,(key_type *)local_b0);
              std::__cxx11::string::operator=((string *)this_05,local_280);
              std::__cxx11::string::~string(local_280);
              ppcVar5 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>_>
                        ::operator[](&this->TargetPtrs,(key_type *)local_b0);
              *ppcVar5 = (mapped_type)0x0;
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_260);
              __range1._4_4_ = __range1._4_4_ + 1;
            }
          }
          std::__cxx11::string::~string((string *)local_b0);
          __gnu_cxx::
          __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>_>
          ::operator++(&__end3);
        }
      }
      __gnu_cxx::
      __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
    ::operator++(&__end1);
  }
  return __range1._4_4_;
}

Assistant:

int cmGraphVizWriter::CollectAllExternalLibs(int cnt)
{
  // Ok, now find all the stuff we link to that is not in cmake
  for (cmLocalGenerator* lg : this->LocalGenerators) {
    const std::vector<cmGeneratorTarget*>& targets = lg->GetGeneratorTargets();
    for (cmGeneratorTarget* target : targets) {
      const std::string& realTargetName = target->GetName();
      if (this->IgnoreThisTarget(realTargetName)) {
        // Skip ignored targets
        continue;
      }
      const cmTarget::LinkLibraryVectorType* ll =
        &(target->Target->GetOriginalLinkLibraries());
      for (auto const& llit : *ll) {
        std::string libName = llit.first;
        if (this->IgnoreThisTarget(libName)) {
          // Skip ignored targets
          continue;
        }

        if (GlobalGenerator->IsAlias(libName)) {
          const auto tgt = GlobalGenerator->FindTarget(libName);
          if (tgt) {
            libName = tgt->GetName();
          }
        }

        std::map<std::string, const cmGeneratorTarget*>::const_iterator tarIt =
          this->TargetPtrs.find(libName);
        if (tarIt == this->TargetPtrs.end()) {
          std::ostringstream ostr;
          ostr << this->GraphNodePrefix << cnt++;
          this->TargetNamesNodes[libName] = ostr.str();
          this->TargetPtrs[libName] = nullptr;
          // str << "    \"" << ostr << "\" [ label=\"" << libName
          // <<  "\" shape=\"ellipse\"];" << std::endl;
        }
      }
    }
  }
  return cnt;
}